

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int Run<std::_Bind<int(*(AmsNetId,unsigned_short,std::__cxx11::string,bhf::Commandline))(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)>>
              (_Bind<int_(*(AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline))(AmsNetId,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::Commandline_&)>
               *f,size_t retries)

{
  tuple<AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
  *ptVar1;
  int iVar2;
  int *piVar3;
  stringstream stream;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  _Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
  *local_280;
  _Bind<int_(*(AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline))(AmsNetId,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::Commandline_&)>
  local_278;
  _Bind<int_(*(AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline))(AmsNetId,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::Commandline_&)>
  local_218;
  timespec local_1b8;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_218._M_f = f->_M_f;
  ptVar1 = &local_218._M_bound_args;
  local_280 = (_Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
               *)&f->_M_bound_args;
  std::
  _Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
  ::_Tuple_impl((_Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                 *)ptVar1,local_280);
  local_218._M_bound_args.
  super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
  .
  super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
  .super__Head_base<1UL,_unsigned_short,_false>._M_head_impl =
       (f->_M_bound_args).
       super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
       .
       super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
       .super__Head_base<1UL,_unsigned_short,_false>._M_head_impl;
  local_218._M_bound_args.
  super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
  .
  super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
  ._82_4_ = *(undefined4 *)
             &(f->_M_bound_args).
              super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
              .
              super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
              .field_0x52;
  local_218._M_bound_args.
  super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
  .
  super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
  ._86_2_ = *(undefined2 *)
             &(f->_M_bound_args).
              super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
              .
              super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
              .field_0x56;
  iVar2 = TryRun<std::_Bind<int(*(AmsNetId,unsigned_short,std::__cxx11::string,bhf::Commandline))(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)>>
                    (&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_bound_args.
         super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
         .
         super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_218._M_bound_args.
                 super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                 .
                 super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                 .
                 super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                 .
                 super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         + 0x10U)) {
    operator_delete(local_218._M_bound_args.
                    super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                    .
                    super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if (local_218._M_bound_args.
      super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
      .
      super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
      .
      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
      .super__Tuple_impl<3UL,_bhf::Commandline>.super__Head_base<3UL,_bhf::Commandline,_false>.
      _M_head_impl.usage.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_218._M_bound_args.
      super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
      .
      super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
      .
      super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
      .super__Tuple_impl<3UL,_bhf::Commandline>.super__Head_base<3UL,_bhf::Commandline,_false>.
      _M_head_impl.usage.super__Function_base._M_manager)
              ((_Any_data *)ptVar1,(_Any_data *)ptVar1,__destroy_functor);
  }
  if (retries != 0 && iVar2 != 0) {
    ptVar1 = &local_278._M_bound_args;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Command failed, retrying...\n",0x1c);
      std::__cxx11::stringbuf::str();
      Logger::Log(2,(string *)local_2a0);
      if (local_2a0[0] != local_290) {
        operator_delete(local_2a0[0]);
      }
      retries = retries - 1;
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
      local_1b8.tv_sec = 1;
      local_1b8.tv_nsec = 0;
      do {
        iVar2 = nanosleep(&local_1b8,&local_1b8);
        if (iVar2 != -1) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      local_278._M_f = f->_M_f;
      std::
      _Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
      ::_Tuple_impl((_Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                     *)ptVar1,local_280);
      local_278._M_bound_args.
      super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
      .
      super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
      .super__Head_base<1UL,_unsigned_short,_false>._M_head_impl =
           (f->_M_bound_args).
           super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
           .
           super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
           .super__Head_base<1UL,_unsigned_short,_false>._M_head_impl;
      local_278._M_bound_args.
      super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
      .
      super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
      ._86_2_ = *(undefined2 *)
                 &(f->_M_bound_args).
                  super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                  .
                  super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                  .field_0x56;
      local_278._M_bound_args.
      super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
      .
      super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
      ._82_4_ = *(undefined4 *)
                 &(f->_M_bound_args).
                  super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                  .
                  super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                  .field_0x52;
      iVar2 = TryRun<std::_Bind<int(*(AmsNetId,unsigned_short,std::__cxx11::string,bhf::Commandline))(AmsNetId,unsigned_short,std::__cxx11::string_const&,bhf::Commandline&)>>
                        (&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_bound_args.
             super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
             .
             super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
             .
             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
             .
             super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&local_278._M_bound_args.
                     super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                     .
                     super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                     .
                     super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                     .
                     super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             + 0x10U)) {
        operator_delete(local_278._M_bound_args.
                        super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                        .
                        super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                        .
                        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
                        .
                        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        ._M_head_impl._M_dataplus._M_p);
      }
      if (local_278._M_bound_args.
          super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
          .
          super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
          .
          super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
          .super__Tuple_impl<3UL,_bhf::Commandline>.super__Head_base<3UL,_bhf::Commandline,_false>.
          _M_head_impl.usage.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_278._M_bound_args.
          super__Tuple_impl<0UL,_AmsNetId,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
          .
          super__Tuple_impl<1UL,_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
          .
          super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::Commandline>
          .super__Tuple_impl<3UL,_bhf::Commandline>.super__Head_base<3UL,_bhf::Commandline,_false>.
          _M_head_impl.usage.super__Function_base._M_manager)
                  ((_Any_data *)ptVar1,(_Any_data *)ptVar1,__destroy_functor);
      }
      if (iVar2 == 0) {
        return 0;
      }
    } while (retries != 0);
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Too many retries, giving up!\n",0x1d);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,(string *)local_2a0);
    if (local_2a0[0] != local_290) {
      operator_delete(local_2a0[0]);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return iVar2;
}

Assistant:

int Run(T f, size_t retries)
{
    auto result = TryRun(f);

    // success or no retry allowed
    if (!result || !retries) {
        return result;
    }

    while (retries-- > 0) {
        LOG_WARN("Command failed, retrying...\n");
        std::this_thread::sleep_for(std::chrono::seconds(1));
        result = TryRun(f);
        if (!result) {
            return 0;
        }
    }
    LOG_ERROR("Too many retries, giving up!\n");
    return result;
}